

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

usize __thiscall
Console::Prompt::Private::readNextUnbufferedEscapedSequence
          (Private *this,char *buffer,char firschar,char laschar)

{
  code *pcVar1;
  int iVar2;
  ssize_t sVar3;
  usize uVar4;
  char sequenceType;
  usize len;
  char ch;
  char laschar_local;
  byte *pbStack_18;
  char firschar_local;
  char *buffer_local;
  Private *this_local;
  
  len._6_1_ = laschar;
  len._7_1_ = firschar;
  pbStack_18 = (byte *)buffer;
  buffer_local = &this->valid;
  while( true ) {
    while( true ) {
      sVar3 = read(0,(void *)((long)&len + 5),1);
      if (sVar3 != 1) {
        iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                              ,0x40a,"read(STDIN_FILENO, &ch, 1) == 1");
        if (iVar2 != 0) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
      if (len._5_1_ == '\x1b') break;
      Buffer::append(&this->bufferedInput,(byte *)((long)&len + 5),1);
    }
    *pbStack_18 = '\x1b';
    pbStack_18[1] = '\0';
    uVar4 = readUnbufferedEscapedSequence(this,(char *)pbStack_18,(char *)(pbStack_18 + 1));
    if ((pbStack_18[uVar4] == len._6_1_) && (pbStack_18[1] == len._7_1_)) break;
    Buffer::append(&this->bufferedInput,pbStack_18,uVar4 + 1);
  }
  return uVar4 + 1;
}

Assistant:

usize readNextUnbufferedEscapedSequence(char* buffer, char firschar, char laschar)
  {
    for(char ch;;)
    {
      VERIFY(read(STDIN_FILENO, &ch, 1) == 1);
      if(ch == '\x1b')
      {
        *buffer = ch;
        buffer[1] = 0;
        usize len = 1 + readUnbufferedEscapedSequence(buffer, buffer + 1);
        char sequenceType = buffer[len - 1];
        if(sequenceType != laschar || buffer[1] != firschar)
        {
          bufferedInput.append((byte*)buffer, len);
          continue;
        }
        return len;
      }
      else
        bufferedInput.append((byte*)&ch, 1);
    }
  }